

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

double Open_JTalk_get_gv_weight(Open_JTalk *open_jtalk,size_t i,_Bool *error)

{
  undefined1 *in_RDX;
  size_t in_RSI;
  long in_RDI;
  undefined8 local_8;
  
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RDI == 0) {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    local_8 = 0.0;
  }
  else if ((in_RSI == 0) || (in_RSI == 1)) {
    local_8 = HTS_Engine_get_gv_weight((HTS_Engine *)(in_RDI + 0x50),in_RSI);
  }
  else {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double Open_JTalk_get_gv_weight(Open_JTalk *open_jtalk, size_t i, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	if (i != 0 && i != 1)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return HTS_Engine_get_gv_weight(&open_jtalk->engine, i);
}